

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter-basic.c
# Opt level: O2

hd_stream * hd_open_null(hd_context *ctx,hd_stream *chain,int len,hd_off_t offset)

{
  hd_error_stack_slot *phVar1;
  int iVar2;
  undefined8 *state;
  hd_stream *phVar3;
  
  if (len < 1) {
    len = 0;
  }
  iVar2 = hd_push_try(ctx);
  if (iVar2 != 0) {
    iVar2 = __sigsetjmp(ctx->error->top->buffer,0);
    if (iVar2 == 0) {
      state = (undefined8 *)hd_calloc(ctx,1,0x1018);
      *state = chain;
      state[1] = (ulong)(uint)len;
      state[2] = (long)offset;
      goto LAB_00112057;
    }
  }
  state = (undefined8 *)0x0;
LAB_00112057:
  phVar1 = ctx->error->top;
  ctx->error->top = phVar1 + -1;
  if (phVar1->code < 2) {
    phVar3 = hd_new_stream(ctx,state,next_null,close_null);
    return phVar3;
  }
  hd_drop_stream(ctx,chain);
  hd_rethrow(ctx);
}

Assistant:

hd_stream *
hd_open_null(hd_context *ctx, hd_stream *chain, int len, hd_off_t offset)
{
    struct null_filter *state = NULL;

    if (len < 0)
        len = 0;
    hd_try(ctx)
    {
        state = hd_malloc_struct(ctx, struct null_filter);
        state->chain = chain;
        state->remain = len;
        state->offset = offset;
    }
    hd_catch(ctx)
    {
        hd_drop_stream(ctx, chain);
        hd_rethrow(ctx);
    }

    return hd_new_stream(ctx, state, next_null, close_null);
}